

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSetMap.cxx
# Opt level: O3

cmExportSet * __thiscall cmExportSetMap::operator[](cmExportSetMap *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  iterator iVar3;
  cmExportSet *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_bool>
  pVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>
  local_48;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
       )._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (cmExportSet *)operator_new(0x50);
    cmExportSet::cmExportSet(this_00,name);
    paVar1 = &local_48.first.field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    local_48.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + name->_M_string_length);
    local_48.second = this_00;
    pVar4 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmExportSet*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmExportSet*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmExportSet*>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,cmExportSet*>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmExportSet*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmExportSet*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmExportSet*>>>
                        *)this,&local_48);
    iVar3._M_node = (_Base_ptr)pVar4.first._M_node;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_48.first._M_dataplus._M_p,
                      local_48.first.field_2._M_allocated_capacity + 1);
    }
  }
  return *(cmExportSet **)(iVar3._M_node + 2);
}

Assistant:

cmExportSet* cmExportSetMap::operator[](const std::string &name)
{
  std::map<std::string, cmExportSet*>::iterator it = this->find(name);
  if (it == this->end()) // Export set not found
    {
    it = this->insert(std::make_pair(name, new cmExportSet(name))).first;
    }
  return it->second;
}